

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O3

void __thiscall
cmComputeLinkDepends::HandleSharedDependency(cmComputeLinkDepends *this,SharedDepEntry *dep)

{
  int iVar1;
  pointer pLVar2;
  cmGeneratorTarget *this_00;
  iterator iVar3;
  cmLinkInterface *iface;
  long lVar4;
  int index;
  bool local_4d;
  int local_4c;
  cmListFileBacktrace local_48;
  
  iVar3 = std::
          _Rb_tree<cmLinkItem,_std::pair<const_cmLinkItem,_int>,_std::_Select1st<std::pair<const_cmLinkItem,_int>_>,_std::less<cmLinkItem>,_std::allocator<std::pair<const_cmLinkItem,_int>_>_>
          ::find(&(this->LinkEntryIndex)._M_t,&dep->Item);
  if ((_Rb_tree_header *)iVar3._M_node == &(this->LinkEntryIndex)._M_t._M_impl.super__Rb_tree_header
     ) {
    iVar3._M_node = (_Base_ptr)AllocateLinkEntry(this,&dep->Item);
    iVar1 = *(int *)&iVar3._M_node[2]._M_right;
    pLVar2 = (this->EntryList).
             super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    cmLinkItem::AsStr_abi_cxx11_(&dep->Item);
    std::__cxx11::string::_M_assign((string *)(pLVar2 + iVar1));
    pLVar2[iVar1].Target = (dep->Item).Target;
    pLVar2[iVar1].IsSharedDep = true;
  }
  local_4c = *(int *)&iVar3._M_node[2]._M_right;
  lVar4 = (long)local_4c;
  pLVar2 = (this->EntryList).
           super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_4d = true;
  local_48.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_48.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::emplace_back<int&,bool,cmListFileBacktrace>
            ((vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)
             ((this->EntryConstraintGraph).
              super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
              super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
              super__Vector_impl_data._M_start + dep->DependerIndex),&local_4c,&local_4d,&local_48);
  if (local_48.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.TopEntry.
               super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  this_00 = pLVar2[lVar4].Target;
  if (this_00 != (cmGeneratorTarget *)0x0) {
    iface = cmGeneratorTarget::GetLinkInterface(this_00,&this->Config,this->Target);
    if (iface != (cmLinkInterface *)0x0) {
      FollowSharedDeps(this,local_4c,iface,true);
    }
  }
  return;
}

Assistant:

void cmComputeLinkDepends::HandleSharedDependency(SharedDepEntry const& dep)
{
  // Check if the target already has an entry.
  std::map<cmLinkItem, int>::iterator lei =
    this->LinkEntryIndex.find(dep.Item);
  if (lei == this->LinkEntryIndex.end()) {
    // Allocate a spot for the item entry.
    lei = this->AllocateLinkEntry(dep.Item);

    // Initialize the item entry.
    LinkEntry& entry = this->EntryList[lei->second];
    entry.Item = dep.Item.AsStr();
    entry.Target = dep.Item.Target;

    // This item was added specifically because it is a dependent
    // shared library.  It may get special treatment
    // in cmComputeLinkInformation.
    entry.IsSharedDep = true;
  }

  // Get the link entry for this target.
  int index = lei->second;
  LinkEntry& entry = this->EntryList[index];

  // This shared library dependency must follow the item that listed
  // it.
  this->EntryConstraintGraph[dep.DependerIndex].emplace_back(
    index, true, cmListFileBacktrace());

  // Target items may have their own dependencies.
  if (entry.Target) {
    if (cmLinkInterface const* iface =
          entry.Target->GetLinkInterface(this->Config, this->Target)) {
      // Follow public and private dependencies transitively.
      this->FollowSharedDeps(index, iface, true);
    }
  }
}